

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O0

int skip_nyt_bits(int nyt_size)

{
  bool bVar1;
  uint local_c;
  int nyt_size_local;
  
  in_bit_idx = nyt_size + in_bit_idx;
  bVar1 = last_bit_idx < in_bit_idx;
  if (bVar1) {
    log_error("adh_decompress_file","too many bits read: in_bit_idx (%u) > last_bit_idx (%u)",
              in_bit_idx,last_bit_idx);
  }
  local_c = (uint)bVar1;
  return local_c;
}

Assistant:

int skip_nyt_bits(int nyt_size) {
#ifdef _DEBUG
    log_debug("skip_nyt_bits", "in_bit_idx=%-8u nyt_size=%d\n", in_bit_idx, nyt_size);
#endif

    in_bit_idx += nyt_size;

    if(in_bit_idx > last_bit_idx) {
        log_error("adh_decompress_file", "too many bits read: in_bit_idx (%u) > last_bit_idx (%u)", in_bit_idx, last_bit_idx);
        return RC_FAIL;
    }
    return RC_OK;
}